

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

char16_t * __thiscall
QUtf8::convertToUnicode(QUtf8 *this,char16_t *dst,QByteArrayView in,State *state)

{
  QUtf8 *pQVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  long lVar25;
  byte *pbVar26;
  byte *pbVar27;
  byte *pbVar28;
  uint *puVar29;
  QUtf8 *pQVar30;
  long lVar31;
  ulong uVar32;
  uint c_1;
  long lVar33;
  char16_t *__n;
  char16_t cVar34;
  byte *pbVar35;
  size_t __n_00;
  long in_FS_OFFSET;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  byte local_3c [4];
  long local_38;
  
  puVar29 = (uint *)in.m_data;
  pbVar35 = (byte *)in.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (dst == (char16_t *)0x0) goto LAB_0012519f;
  uVar4 = *puVar29;
  cVar34 = L'�';
  if ((uVar4 & 2) != 0) {
    cVar34 = L'\0';
  }
  pbVar27 = pbVar35;
  if ((uVar4 & 1) == 0) {
    uVar5 = puVar29[1];
    lVar25 = *(long *)(puVar29 + 2);
    if (lVar25 != 0 || (uVar4 & 8) == 0 && (uVar5 & 1) == 0) {
      __n = (char16_t *)(4 - lVar25);
      if ((long)dst <= 4 - lVar25) {
        __n = dst;
      }
      local_3c[0] = 0;
      local_3c[1] = 0;
      local_3c[2] = 0;
      local_3c[3] = 0;
      __memcpy_chk(local_3c,puVar29 + 6,lVar25,4);
      memcpy(local_3c + lVar25,pbVar35,(size_t)__n);
      if (-1 < (char)local_3c[0]) {
        *(ushort *)this = (ushort)local_3c[0];
        pQVar30 = this + 2;
        if (((uVar4 & 8) == 0 && (uVar5 & 1) == 0) && (*(short *)this == -0x101)) {
          pQVar30 = this;
        }
        puVar29[1] = uVar5 | 1;
        lVar25 = 1 - lVar25;
        this = pQVar30;
        goto LAB_00124ead;
      }
      if (0xc1 < local_3c[0]) {
        if (local_3c[0] < 0xe0) {
          lVar33 = 2;
        }
        else if (local_3c[0] < 0xf0) {
          lVar33 = 3;
        }
        else {
          if (0xf4 < local_3c[0]) goto LAB_00125361;
          lVar33 = 4;
        }
        lVar31 = (long)(local_3c + lVar25 + (long)__n) - (long)(local_3c + 1);
        if ((lVar31 < lVar33 + -1) && (lVar31 < 1)) {
          __n_00 = (long)__n + lVar25;
          *(size_t *)(puVar29 + 2) = __n_00;
          pbVar27 = local_3c;
LAB_001252f1:
          memcpy(puVar29 + 6,pbVar27,__n_00);
          goto LAB_0012519f;
        }
      }
LAB_00125361:
      *(long *)(puVar29 + 4) = *(long *)(puVar29 + 4) + 1;
      *(char16_t *)this = cVar34;
      this = this + 2;
      puVar29[1] = uVar5 | 1;
      pbVar27 = pbVar35 + 1;
    }
  }
  else if (((2 < (long)dst && (char)((uVar4 & 8) >> 3) == '\0') && (*pbVar35 == 0xef)) &&
          (pbVar35[1] == 0xbb)) {
    lVar25 = (ulong)(pbVar35[2] == 0xbf) * 3;
LAB_00124ead:
    pbVar27 = pbVar35 + lVar25;
  }
  pbVar35 = pbVar35 + (long)dst;
  if (pbVar35 != pbVar27 && -1 < (long)pbVar35 - (long)pbVar27) {
LAB_00124ed8:
    lVar25 = (long)pbVar35 - (long)pbVar27;
    pbVar26 = pbVar35;
    if (0xf < lVar25) {
      pbVar26 = pbVar27 + -0x10;
      lVar33 = 0x10;
      pQVar30 = this + -0x20;
LAB_00124ef5:
      if (lVar33 < lVar25) goto code_r0x00124efa;
      auVar2 = *(undefined1 (*) [16])(pbVar35 + -0x10);
      uVar6 = (ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar2[0xf] >> 7) << 0xf;
      auVar8[0xd] = 0;
      auVar8._0_13_ = auVar2._0_13_;
      auVar8[0xe] = auVar2[7];
      auVar10[0xc] = auVar2[6];
      auVar10._0_12_ = auVar2._0_12_;
      auVar10._13_2_ = auVar8._13_2_;
      auVar12[0xb] = 0;
      auVar12._0_11_ = auVar2._0_11_;
      auVar12._12_3_ = auVar10._12_3_;
      auVar14[10] = auVar2[5];
      auVar14._0_10_ = auVar2._0_10_;
      auVar14._11_4_ = auVar12._11_4_;
      auVar16[9] = 0;
      auVar16._0_9_ = auVar2._0_9_;
      auVar16._10_5_ = auVar14._10_5_;
      auVar18[8] = auVar2[4];
      auVar18._0_8_ = auVar2._0_8_;
      auVar18._9_6_ = auVar16._9_6_;
      auVar20._7_8_ = 0;
      auVar20._0_7_ = auVar18._8_7_;
      auVar23._1_8_ = SUB158(auVar20 << 0x40,7);
      auVar23[0] = auVar2[3];
      auVar23._9_6_ = 0;
      auVar24._1_10_ = SUB1510(auVar23 << 0x30,5);
      auVar24[0] = auVar2[2];
      auVar24._11_4_ = 0;
      auVar39._3_12_ = SUB1512(auVar24 << 0x20,3);
      auVar39[2] = auVar2[1];
      auVar39[0] = auVar2[0];
      auVar39[1] = 0;
      auVar39[0xf] = 0;
      *(undefined1 (*) [16])(this + lVar25 * 2 + -0x20) = auVar39;
      auVar37[1] = 0;
      auVar37[0] = auVar2[8];
      auVar37[2] = auVar2[9];
      auVar37[3] = 0;
      auVar37[4] = auVar2[10];
      auVar37[5] = 0;
      auVar37[6] = auVar2[0xb];
      auVar37[7] = 0;
      auVar37[8] = auVar2[0xc];
      auVar37[9] = 0;
      auVar37[10] = auVar2[0xd];
      auVar37[0xb] = 0;
      auVar37[0xc] = auVar2[0xe];
      auVar37[0xd] = 0;
      auVar37[0xe] = auVar2[0xf];
      auVar37[0xf] = 0;
      *(undefined1 (*) [16])(this + lVar25 * 2 + -0x10) = auVar37;
      if (uVar6 == 0) {
        this = this + lVar25 * 2;
      }
      else {
        uVar4 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        pbVar27 = *(undefined1 (*) [16])(pbVar35 + -0x10) + uVar4;
        this = this + (ulong)uVar4 * 2 + lVar25 * 2 + -0x20;
        if (pbVar27 != pbVar35) {
          uVar4 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
            }
          }
          pbVar26 = pbVar35 + ((ulong)uVar4 - 0xf);
          goto LAB_00124fa8;
        }
      }
      goto LAB_00125197;
    }
    goto LAB_00124fa8;
  }
LAB_00125197:
  puVar29[2] = 0;
  puVar29[3] = 0;
LAB_0012519f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (char16_t *)this;
  }
  __stack_chk_fail();
code_r0x00124efa:
  pQVar1 = pQVar30 + 0x20;
  auVar2 = *(undefined1 (*) [16])(pbVar26 + 0x10);
  pbVar26 = pbVar26 + 0x10;
  uVar6 = (ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar2[0xf] >> 7) << 0xf;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar2._0_13_;
  auVar7[0xe] = auVar2[7];
  auVar9[0xc] = auVar2[6];
  auVar9._0_12_ = auVar2._0_12_;
  auVar9._13_2_ = auVar7._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = auVar2._0_11_;
  auVar11._12_3_ = auVar9._12_3_;
  auVar13[10] = auVar2[5];
  auVar13._0_10_ = auVar2._0_10_;
  auVar13._11_4_ = auVar11._11_4_;
  auVar15[9] = 0;
  auVar15._0_9_ = auVar2._0_9_;
  auVar15._10_5_ = auVar13._10_5_;
  auVar17[8] = auVar2[4];
  auVar17._0_8_ = auVar2._0_8_;
  auVar17._9_6_ = auVar15._9_6_;
  auVar19._7_8_ = 0;
  auVar19._0_7_ = auVar17._8_7_;
  auVar21._1_8_ = SUB158(auVar19 << 0x40,7);
  auVar21[0] = auVar2[3];
  auVar21._9_6_ = 0;
  auVar22._1_10_ = SUB1510(auVar21 << 0x30,5);
  auVar22[0] = auVar2[2];
  auVar22._11_4_ = 0;
  auVar38._3_12_ = SUB1512(auVar22 << 0x20,3);
  auVar38[2] = auVar2[1];
  auVar38[0] = auVar2[0];
  auVar38[1] = 0;
  auVar38[0xf] = 0;
  *(undefined1 (*) [16])(pQVar30 + 0x20) = auVar38;
  auVar36[1] = 0;
  auVar36[0] = auVar2[8];
  auVar36[2] = auVar2[9];
  auVar36[3] = 0;
  auVar36[4] = auVar2[10];
  auVar36[5] = 0;
  auVar36[6] = auVar2[0xb];
  auVar36[7] = 0;
  auVar36[8] = auVar2[0xc];
  auVar36[9] = 0;
  auVar36[10] = auVar2[0xd];
  auVar36[0xb] = 0;
  auVar36[0xc] = auVar2[0xe];
  auVar36[0xd] = 0;
  auVar36[0xe] = auVar2[0xf];
  auVar36[0xf] = 0;
  *(undefined1 (*) [16])(pQVar30 + 0x30) = auVar36;
  lVar33 = lVar33 + 0x10;
  pQVar30 = pQVar1;
  if (uVar6 != 0) goto code_r0x00124f2e;
  goto LAB_00124ef5;
code_r0x00124f2e:
  uVar4 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
    }
  }
  uVar32 = (ulong)uVar4;
  if (pbVar26 + uVar32 == pbVar35) {
    this = pQVar1 + uVar32 * 2;
    goto LAB_00125197;
  }
  uVar4 = 0x1f;
  if (uVar6 != 0) {
    for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  this = pQVar1 + uVar32 * 2;
  pbVar27 = pbVar26 + uVar32;
  pbVar26 = pbVar26 + (ulong)uVar4 + 1;
LAB_00124fa8:
  do {
    pbVar28 = pbVar27 + 1;
    bVar3 = *pbVar27;
    if ((char)bVar3 < '\0') {
      if (bVar3 < 0xc2) {
LAB_0012513a:
        *(long *)(puVar29 + 4) = *(long *)(puVar29 + 4) + 1;
        *(char16_t *)this = cVar34;
        goto LAB_00125142;
      }
      if (bVar3 < 0xe0) {
        lVar25 = 1;
      }
      else if (bVar3 < 0xf0) {
        lVar25 = 2;
      }
      else {
        if (0xf4 < bVar3) goto LAB_0012513a;
        lVar25 = 3;
      }
      if ((lVar25 <= (long)pbVar35 - (long)pbVar28) || (0 < (long)pbVar35 - (long)pbVar28))
      goto LAB_0012513a;
      if ((*puVar29 & 1) != 0) {
        *(char16_t *)this = L'�';
        lVar25 = *(long *)(puVar29 + 4);
        while( true ) {
          this = this + 2;
          lVar25 = lVar25 + 1;
          if (pbVar35 <= pbVar28) break;
          pbVar28 = pbVar28 + 1;
          *(char16_t *)this = L'�';
        }
        *(long *)(puVar29 + 4) = lVar25;
        goto LAB_00125197;
      }
      __n_00 = (long)pbVar35 - (long)pbVar27;
      *(size_t *)(puVar29 + 2) = __n_00;
      goto LAB_001252f1;
    }
    *(ushort *)this = (ushort)bVar3;
LAB_00125142:
    this = this + 2;
    pbVar27 = pbVar28;
  } while (pbVar28 < pbVar26);
  if (pbVar35 <= pbVar28) goto LAB_00125197;
  goto LAB_00124ed8;
}

Assistant:

char16_t *QUtf8::convertToUnicode(char16_t *dst, QByteArrayView in, QStringConverter::State *state)
{
    qsizetype len = in.size();

    Q_ASSERT(state);
    if (!len)
        return dst;


    char16_t replacement = QChar::ReplacementCharacter;
    if (state->flags & QStringConverter::Flag::ConvertInvalidToNull)
        replacement = QChar::Null;

    qsizetype res;

    const uchar *src = reinterpret_cast<const uchar *>(in.data());
    const uchar *end = src + len;

    if (!(state->flags & QStringConverter::Flag::Stateless)) {
        bool headerdone = state->internalState & HeaderDone || state->flags & QStringConverter::Flag::ConvertInitialBom;
        if (state->remainingChars || !headerdone) {
            // handle incoming state first
            uchar remainingCharsData[4]; // longest UTF-8 sequence possible
            qsizetype remainingCharsCount = state->remainingChars;
            qsizetype newCharsToCopy = qMin<qsizetype>(sizeof(remainingCharsData) - remainingCharsCount, end - src);

            memset(remainingCharsData, 0, sizeof(remainingCharsData));
            memcpy(remainingCharsData, &state->state_data[0], remainingCharsCount);
            memcpy(remainingCharsData + remainingCharsCount, src, newCharsToCopy);

            const uchar *begin = &remainingCharsData[1];
            res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(remainingCharsData[0], dst, begin,
                    static_cast<const uchar *>(remainingCharsData) + remainingCharsCount + newCharsToCopy);
            if (res == QUtf8BaseTraits::Error) {
                ++state->invalidChars;
                *dst++ = replacement;
                ++src;
            } else if (res == QUtf8BaseTraits::EndOfString) {
                // if we got EndOfString again, then there were too few bytes in src;
                // copy to our state and return
                state->remainingChars = remainingCharsCount + newCharsToCopy;
                memcpy(&state->state_data[0], remainingCharsData, state->remainingChars);
                return dst;
            } else if (!headerdone) {
                // eat the UTF-8 BOM
                if (dst[-1] == 0xfeff)
                    --dst;
            }
            state->internalState |= HeaderDone;

            // adjust src now that we have maybe consumed a few chars
            if (res >= 0) {
                Q_ASSERT(res > remainingCharsCount);
                src += res - remainingCharsCount;
            }
        }
    } else if (!(state->flags & QStringConverter::Flag::ConvertInitialBom)) {
        // stateless, remove initial BOM
        if (len > 2 && src[0] == utf8bom[0] && src[1] == utf8bom[1] && src[2] == utf8bom[2])
            // skip BOM
            src += 3;
    }

    // main body, stateless decoding
    res = 0;
    dst = convertToUnicode(dst, { src, end }, [&](char16_t *&dst, const uchar *src_, int res_) {
        res = res_;
        src = src_;
        if (res == QUtf8BaseTraits::Error) {
            res = 0;
            ++state->invalidChars;
            *dst++ = replacement;
        }
        return res == 0;    // continue if plain decoding error
    });

    if (res == QUtf8BaseTraits::EndOfString) {
        // unterminated UTF sequence
        if (state->flags & QStringConverter::Flag::Stateless) {
            *dst++ = QChar::ReplacementCharacter;
            ++state->invalidChars;
            while (src++ < end) {
                *dst++ = QChar::ReplacementCharacter;
                ++state->invalidChars;
            }
            state->remainingChars = 0;
        } else {
            --src; // unread the byte in ch
            state->remainingChars = end - src;
            memcpy(&state->state_data[0], src, end - src);
        }
    } else {
        state->remainingChars = 0;
    }

    return dst;
}